

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

void __thiscall
QCborContainerPrivate::replaceAt_complex
          (QCborContainerPrivate *this,Element *e,QCborValue *value,ContainerDisposition disp)

{
  Type TVar1;
  QFlagsStorage<QtCbor::Element::ValueFlag> QVar2;
  anon_union_8_2_4ee71171_for_Element_0 aVar3;
  const_reference pEVar4;
  ByteData *this_00;
  ByteData *this_01;
  qptrdiff qVar5;
  int in_ECX;
  QCborValue *__arg;
  QCborValue *in_RDX;
  QCborValue *extraout_RDX;
  QCborValue *pQVar6;
  anon_union_8_2_4ee71171_for_Element_0 *in_RSI;
  QCborContainerPrivate *in_RDI;
  long in_FS_OFFSET;
  ByteData *b;
  QCborContainerPrivate *d;
  QByteArray valueData;
  ValueFlags flags;
  undefined4 in_stack_ffffffffffffff78;
  ValueFlag in_stack_ffffffffffffff7c;
  QCborContainerPrivate *in_stack_ffffffffffffff80;
  QCborContainerPrivate *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  QByteArray local_30;
  QFlagsStorage<QtCbor::Element::ValueFlag> local_14;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  undefined4 extraout_var;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX->n < 0) {
    if (in_RDI == in_RDX->container) {
      __arg = in_RDX;
      pQVar6 = in_RDX;
      if (in_ECX == 1) {
        QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x21bd94);
        pQVar6 = extraout_RDX;
      }
      aVar3._0_4_ = clone((__fn *)in_RDI,(void *)0xffffffffffffffff,(int)pQVar6,__arg);
      aVar3.value._4_4_ = extraout_var;
      QList<QtCbor::Element>::detach((QList<QtCbor::Element> *)0x21bdb8);
      QBasicAtomicInteger<int>::storeRelaxed
                ((QBasicAtomicInteger<int> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      *in_RSI = aVar3;
    }
    else {
      *in_RSI = (anon_union_8_2_4ee71171_for_Element_0)in_RDX->container;
      if (in_ECX == 0) {
        QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x21bdfb);
      }
    }
    TVar1 = QCborValue::type(in_RDX);
    *(Type *)(in_RSI + 1) = TVar1;
    QFlags<QtCbor::Element::ValueFlag>::QFlags
              ((QFlags<QtCbor::Element::ValueFlag> *)in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff7c);
    *(undefined4 *)((long)in_RSI + 0xc) = local_c;
  }
  else {
    pEVar4 = QList<QtCbor::Element>::at
                       ((QList<QtCbor::Element> *)in_stack_ffffffffffffff80,
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    *in_RSI = pEVar4->field_0;
    in_RSI[1] = *(anon_union_8_2_4ee71171_for_Element_0 *)&pEVar4->type;
    this_00 = byteData(in_stack_ffffffffffffff88,(qsizetype)in_stack_ffffffffffffff80);
    if (this_00 != (ByteData *)0x0) {
      local_10 = *(undefined4 *)((long)in_RSI + 0xc);
      this_01 = (ByteData *)((long)in_RSI + 0xc);
      QVar2.i = (Int)QtCbor::operator~((enum_type)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      local_14.i = (Int)QFlags<QtCbor::Element::ValueFlag>::operator&
                                  ((QFlags<QtCbor::Element::ValueFlag> *)in_stack_ffffffffffffff80,
                                   (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)
                                   SUB84(this_01,0));
      ((QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> *)((long)in_RSI + 0xc))->
      super_QFlagsStorage<QtCbor::Element::ValueFlag> =
           (QFlagsStorage<QtCbor::Element::ValueFlag>)local_14.i;
      if (in_RDI == in_RDX->container) {
        local_30.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_30.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_30.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QtCbor::ByteData::toByteArray(this_01);
        compact((QCborContainerPrivate *)CONCAT44(QVar2.i,in_stack_ffffffffffffff98));
        in_stack_ffffffffffffff80 =
             (QCborContainerPrivate *)QByteArray::operator_cast_to_char_((QByteArray *)0x21bf31);
        QByteArray::size(&local_30);
        qVar5 = addByteData(in_stack_ffffffffffffff80,
                            (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                            0x21bf52);
        in_RSI->value = qVar5;
        QByteArray::~QByteArray((QByteArray *)0x21bf67);
      }
      else {
        compact((QCborContainerPrivate *)CONCAT44(QVar2.i,in_stack_ffffffffffffff98));
        QtCbor::ByteData::byte(this_00);
        qVar5 = addByteData(in_stack_ffffffffffffff80,
                            (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                            0x21bf92);
        in_RSI->value = qVar5;
      }
      *(undefined4 *)((long)in_RSI + 0xc) = local_10;
    }
    if (in_ECX == 1) {
      deref(in_stack_ffffffffffffff80);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCborContainerPrivate::replaceAt_complex(Element &e, const QCborValue &value, ContainerDisposition disp)
{
    if (value.n < 0) {
        // This QCborValue is an array, map, or tagged value (container points
        // to itself).

        // detect self-assignment
        if (Q_UNLIKELY(this == value.container)) {
            Q_ASSERT(ref.loadRelaxed() >= 2);
            if (disp == MoveContainer)
                ref.deref();    // not deref() because it can't drop to 0
            QCborContainerPrivate *d = QCborContainerPrivate::clone(this);
            d->elements.detach();
            d->ref.storeRelaxed(1);
            e.container = d;
        } else {
            e.container = value.container;
            if (disp == CopyContainer)
                e.container->ref.ref();
        }

        e.type = value.type();
        e.flags = Element::IsContainer;
    } else {
        // String data, copy contents
        e = value.container->elements.at(value.n);

        // Copy string data, if any
        if (const ByteData *b = value.container->byteData(value.n)) {
            const auto flags = e.flags;
            // The element e has an invalid e.value, because it is copied from
            // value. It means that calling compact() will trigger an assertion
            // or just silently corrupt the data.
            // Temporarily unset the Element::HasByteData flag in order to skip
            // the element e in the call to compact().
            e.flags = e.flags & ~Element::HasByteData;
            if (this == value.container) {
                const QByteArray valueData = b->toByteArray();
                compact();
                e.value = addByteData(valueData, valueData.size());
            } else {
                compact();
                e.value = addByteData(b->byte(), b->len);
            }
            // restore the flags
            e.flags = flags;
        }

        if (disp == MoveContainer)
            value.container->deref();
    }
}